

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of-test.c++
# Opt level: O0

void __thiscall kj::TestCase101::run(TestCase101 *this)

{
  bool bVar1;
  Tag TVar2;
  OneOf<int,_float,_const_char_*> *pOVar3;
  Fault local_1c8;
  Fault f_5;
  float *_kj_switch_done_8;
  float *n_2;
  undefined1 local_1a8 [7];
  bool _kj_shouldLog_3;
  StringPtr local_198;
  char **local_188;
  char **_kj_switch_done_7;
  char **s_2;
  Fault f_4;
  int *_kj_switch_done_6;
  int *i_2;
  OneOf<int,_float,_const_char_*> *_kj_switch_subject_2;
  OneOf<int,_float,_const_char_*> *constVar;
  Fault f_3;
  float *_kj_switch_done_5;
  float *n_1;
  undefined1 local_130 [7];
  bool _kj_shouldLog_2;
  StringPtr local_120;
  char **local_110;
  char **_kj_switch_done_4;
  char **s_1;
  Fault local_f8;
  Fault f_2;
  int *_kj_switch_done_3;
  int *i_1;
  undefined1 local_d0 [8];
  NullableValue<kj::OneOf<int,_float,_const_char_*>_> _kj_switch_subject_1;
  bool _kj_shouldLog_1;
  Fault f_1;
  float *_kj_switch_done_2;
  float *n;
  undefined1 local_90 [7];
  bool _kj_shouldLog;
  StringPtr local_80;
  char **local_70;
  char **_kj_switch_done_1;
  char **s;
  Fault f;
  int *_kj_switch_done;
  int *i;
  OneOf<int,_float,_const_char_*> *_kj_switch_subject;
  uint count;
  OneOf<int,_float,_const_char_*> local_30;
  undefined1 local_20 [8];
  OneOf<int,_float,_const_char_*> var;
  TestCase101 *this_local;
  
  var.field_1 = (anon_union_8_2_a774ebf0_for_OneOf<int,_float,_const_char_*>_3)this;
  OneOf<int,_float,_const_char_*>::OneOf((OneOf<int,_float,_const_char_*> *)local_20);
  OneOf<int,float,char_const*>::OneOf<char_const(&)[4]>
            ((OneOf<int,float,char_const*> *)&local_30,(char (*) [4])0x654402);
  OneOf<int,_float,_const_char_*>::operator=((OneOf<int,_float,_const_char_*> *)local_20,&local_30);
  OneOf<int,_float,_const_char_*>::~OneOf(&local_30);
  _kj_switch_subject._0_4_ = 0;
  pOVar3 = OneOf<int,_float,_const_char_*>::_switchSubject
                     ((OneOf<int,_float,_const_char_*> *)local_20);
  TVar2 = OneOf<int,_float,_const_char_*>::which(pOVar3);
  if (TVar2 == _variant0) {
    f.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<int>(pOVar3);
    if (f.exception != (Exception *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int&>
                ((Fault *)&s,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x6d,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)f.exception);
      _::Debug::Fault::fatal((Fault *)&s);
    }
    f.exception = (Exception *)0x0;
  }
  else if (TVar2 == _variant1) {
    f_1.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<float>(pOVar3);
    if (f_1.exception != (Exception *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float&>
                ((Fault *)&stack0xffffffffffffff50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x74,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                 (char (*) [26])"expected char*, got float",(float *)f_1.exception);
      _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff50);
    }
    f_1.exception = (Exception *)0x0;
  }
  else if (TVar2 == _variant2) {
    local_70 = OneOf<int,float,char_const*>::get<char_const*>
                         ((OneOf<int,float,char_const*> *)pOVar3);
    _kj_switch_done_1 = local_70;
    while (local_70 != (char **)0x0) {
      StringPtr::StringPtr(&local_80,*_kj_switch_done_1);
      StringPtr::StringPtr((StringPtr *)local_90,"foo");
      bVar1 = StringPtr::operator==(&local_80,(StringPtr *)local_90);
      if (!bVar1) {
        n._7_1_ = _::Debug::shouldLog(ERROR);
        while (n._7_1_ != false) {
          _::Debug::log<char_const(&)[43]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                     ,0x70,ERROR,"\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\"",
                     (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"");
          n._7_1_ = false;
        }
      }
      _kj_switch_subject._0_4_ = (int)_kj_switch_subject + 1;
      local_70 = (char **)0x0;
    }
  }
  if ((int)_kj_switch_subject != 1) {
    _kj_switch_subject_1.field_1._15_1_ = _::Debug::shouldLog(ERROR);
    while (_kj_switch_subject_1.field_1._15_1_ != '\0') {
      _::Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x79,ERROR,"\"failed: expected \" \"count == 1\"",
                 (char (*) [28])"failed: expected count == 1");
      _kj_switch_subject_1.field_1._15_1_ = 0;
    }
  }
  cp<kj::OneOf<int,float,char_const*>>((kj *)&i_1,(OneOf<int,_float,_const_char_*> *)local_20);
  OneOf<int,_float,_const_char_*>::_switchSubject
            ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_d0,
             (OneOf<int,_float,_const_char_*> *)&i_1);
  OneOf<int,_float,_const_char_*>::~OneOf((OneOf<int,_float,_const_char_*> *)&i_1);
  pOVar3 = _::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::operator->
                     ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_d0);
  TVar2 = OneOf<int,_float,_const_char_*>::which(pOVar3);
  if (TVar2 == _variant0) {
    pOVar3 = _::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::operator->
                       ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_d0);
    f_2.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<int>(pOVar3);
    if (f_2.exception != (Exception *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int&>
                (&local_f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x7e,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)f_2.exception);
      _::Debug::Fault::fatal(&local_f8);
    }
    s_1._4_4_ = 0x18;
    f_2.exception = (Exception *)0x0;
  }
  else {
    if (TVar2 == _variant1) {
      pOVar3 = _::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::operator->
                         ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_d0);
      f_3.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<float>(pOVar3);
      if (f_3.exception != (Exception *)0x0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float&>
                  ((Fault *)&constVar,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                   ,0x84,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                   (char (*) [26])"expected char*, got float",(float *)f_3.exception);
        _::Debug::Fault::fatal((Fault *)&constVar);
      }
      f_3.exception = (Exception *)0x0;
    }
    else if (TVar2 == _variant2) {
      pOVar3 = _::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::operator->
                         ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_d0);
      local_110 = OneOf<int,float,char_const*>::get<char_const*>
                            ((OneOf<int,float,char_const*> *)pOVar3);
      _kj_switch_done_4 = local_110;
      while (local_110 != (char **)0x0) {
        StringPtr::StringPtr(&local_120,*_kj_switch_done_4);
        StringPtr::StringPtr((StringPtr *)local_130,"foo");
        bVar1 = StringPtr::operator==(&local_120,(StringPtr *)local_130);
        if (!bVar1) {
          n_1._7_1_ = _::Debug::shouldLog(ERROR);
          while (n_1._7_1_ != false) {
            _::Debug::log<char_const(&)[43]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                       ,0x81,ERROR,"\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\"",
                       (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"");
            n_1._7_1_ = false;
          }
        }
        local_110 = (char **)0x0;
      }
      s_1._4_4_ = 0x18;
      goto LAB_0039ce48;
    }
    s_1._4_4_ = 0;
  }
LAB_0039ce48:
  _::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::~NullableValue
            ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_d0);
  pOVar3 = OneOf<int,_float,_const_char_*>::_switchSubject
                     ((OneOf<int,_float,_const_char_*> *)local_20);
  TVar2 = OneOf<int,_float,_const_char_*>::which(pOVar3);
  if (TVar2 == _variant0) {
    f_4.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<int>(pOVar3);
    if (f_4.exception != (Exception *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int_const&>
                ((Fault *)&s_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x8e,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)f_4.exception);
      _::Debug::Fault::fatal((Fault *)&s_2);
    }
    f_4.exception = (Exception *)0x0;
  }
  else if (TVar2 == _variant1) {
    f_5.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<float>(pOVar3);
    if (f_5.exception != (Exception *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float_const&>
                (&local_1c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x94,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                 (char (*) [26])"expected char*, got float",(float *)f_5.exception);
      _::Debug::Fault::fatal(&local_1c8);
    }
    f_5.exception = (Exception *)0x0;
  }
  else if (TVar2 == _variant2) {
    local_188 = OneOf<int,float,char_const*>::get<char_const*>
                          ((OneOf<int,float,char_const*> *)pOVar3);
    _kj_switch_done_7 = local_188;
    while (local_188 != (char **)0x0) {
      StringPtr::StringPtr(&local_198,*_kj_switch_done_7);
      StringPtr::StringPtr((StringPtr *)local_1a8,"foo");
      bVar1 = StringPtr::operator==(&local_198,(StringPtr *)local_1a8);
      if (!bVar1) {
        n_2._7_1_ = _::Debug::shouldLog(ERROR);
        while (n_2._7_1_ != false) {
          _::Debug::log<char_const(&)[43]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                     ,0x91,ERROR,"\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\"",
                     (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"");
          n_2._7_1_ = false;
        }
      }
      local_188 = (char **)0x0;
    }
  }
  OneOf<int,_float,_const_char_*>::~OneOf((OneOf<int,_float,_const_char_*> *)local_20);
  return;
}

Assistant:

TEST(OneOf, Switch) {
  OneOf<int, float, const char*> var;
  var = "foo";
  uint count = 0;

  {
    KJ_SWITCH_ONEOF(var) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
        ++count;
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }

  KJ_EXPECT(count == 1);

  {
    KJ_SWITCH_ONEOF(kj::cp(var)) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }

  {
    // At one time this failed to compile.
    const auto& constVar = var;
    KJ_SWITCH_ONEOF(constVar) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }
}